

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_settings.cpp
# Opt level: O0

bool __thiscall ON_ParseSettings::IsDecimalExponentSymbol(ON_ParseSettings *this,ON__UINT32 c)

{
  ON__UINT32 c_local;
  ON_ParseSettings *this_local;
  
  if (c == 0x44) {
LAB_007c0054:
    this_local._7_1_ = ParseDAsExponentInScientificENotation(this);
  }
  else {
    if (c != 0x45) {
      if (c == 100) goto LAB_007c0054;
      if ((c != 0x65) && (c != 0x23e8)) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_ParseSettings::IsDecimalExponentSymbol(ON__UINT32 c) const
{
  switch(c)
  {
  case 'e': // lower case e
  case 'E': // capital E
  case 0x23E8: // decimal exponent symbol
    return true;
    break;

  case 'D': // capital D
  case 'd': // lower case d
    return ParseDAsExponentInScientificENotation();
    break;
  }
  return false;
}